

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

void nhdp_domain_init_link(nhdp_link *lnk)

{
  int iVar1;
  list_entity **pplVar2;
  undefined8 uVar3;
  list_entity *plVar4;
  long lVar5;
  
  lnk->flooding_willingness = '\0';
  lnk->local_is_flooding_mpr = false;
  lnk->neigh_is_flooding_mpr = false;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&lnk->_domaindata[0].metric.in + lVar5) = 0xffffff00ffffff;
    uVar3 = oonf_clock_getNow();
    *(undefined8 *)((long)&lnk->_domaindata[0].last_metric_change + lVar5) = uVar3;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  plVar4 = _domain_list.next;
  if ((_domain_list.next)->prev != _domain_list.prev) {
    do {
      if (*(char *)&plVar4[-0x28].next[2].next == '\x01') {
        iVar1 = *(int *)((long)&plVar4[-0x27].next + 4);
        lnk->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar4[-0x28].next[1].next;
        lnk->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar4[-0x28].next[1].next + 4);
      }
      pplVar2 = &plVar4->next;
      plVar4 = *pplVar2;
    } while ((*pplVar2)->prev != _domain_list.prev);
  }
  return;
}

Assistant:

void
nhdp_domain_init_link(struct nhdp_link *lnk) {
  struct nhdp_domain *domain;
  struct nhdp_link_domaindata *data;
  int i;

  /* initialize flooding MPR settings */
  lnk->flooding_willingness = RFC7181_WILLINGNESS_NEVER;
  lnk->local_is_flooding_mpr = false;
  lnk->neigh_is_flooding_mpr = false;

  /* initialize metrics */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lnk->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    lnk->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;
    lnk->_domaindata[i].last_metric_change = oonf_clock_getNow();
  }
  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_linkdata(domain, lnk);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_link_start;
      data->metric.out = domain->metric->outgoing_link_start;
    }
  }
}